

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void llvm::cl::
     apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,char[18],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
               (opt<bool,_false,_llvm::cl::parser<bool>_> *O,char (*M) [18],desc *Ms,
               OptionHidden *Ms_1,initializer<bool> *Ms_2,cat *Ms_3,sub *Ms_4)

{
  StringRef Str;
  opt<bool,_false,_llvm::cl::parser<bool>_> *local_68;
  applicator<char[18]> *local_58 [2];
  cat *local_48;
  cat *Ms_local_3;
  initializer<bool> *Ms_local_2;
  OptionHidden *Ms_local_1;
  desc *Ms_local;
  char (*M_local) [18];
  opt<bool,_false,_llvm::cl::parser<bool>_> *O_local;
  applicator<char[18]> **local_10;
  
  local_10 = local_58;
  local_58[0] = (applicator<char[18]> *)M;
  local_48 = Ms_3;
  Ms_local_3 = (cat *)Ms_2;
  Ms_local_2 = (initializer<bool> *)Ms_1;
  Ms_local_1 = (OptionHidden *)Ms;
  Ms_local = (desc *)M;
  M_local = (char (*) [18])O;
  O_local = (opt<bool,_false,_llvm::cl::parser<bool>_> *)M;
  if (M == (char (*) [18])0x0) {
    local_68 = (opt<bool,_false,_llvm::cl::parser<bool>_> *)0x0;
  }
  else {
    local_68 = (opt<bool,_false,_llvm::cl::parser<bool>_> *)strlen(*M);
  }
  Str.Length = (size_t)M_local;
  Str.Data = (char *)local_68;
  applicator<char[18]>::opt<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>>
            (local_58[0],Str,local_68);
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)M_local,(desc *)Ms_local_1,
             (OptionHidden *)Ms_local_2,(initializer<bool> *)Ms_local_3,local_48,Ms_4);
  return;
}

Assistant:

void apply(Opt *O, const Mod &M, const Mods &... Ms) {
  applicator<Mod>::opt(M, *O);
  apply(O, Ms...);
}